

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

Promise<void> kj::anon_unknown_0::TestWebSocketService::doWebSocket(WebSocket *ws,StringPtr message)

{
  ArrayDisposer *pAVar1;
  PromiseNode *extraout_RDX;
  Promise<void> PVar2;
  ArrayDisposer *local_a8 [2];
  ArrayDisposer *local_98 [3];
  ArrayPtr<const_char> local_80;
  undefined1 local_70 [32];
  Promise<void> local_50;
  undefined1 local_40 [8];
  String copy;
  WebSocket *ws_local;
  StringPtr message_local;
  
  ws_local = (WebSocket *)message.content.size_;
  copy.content.disposer = (ArrayDisposer *)message.content.ptr;
  message_local.content.size_ = (size_t)ws;
  str<kj::StringPtr&>((String *)local_40,(kj *)&ws_local,(StringPtr *)ws_local);
  pAVar1 = copy.content.disposer;
  local_80 = String::operator_cast_to_ArrayPtr((String *)local_40);
  (*pAVar1->_vptr_ArrayDisposer[1])(local_70,pAVar1,local_80.ptr,local_80.size_);
  mv<kj::String>((String *)local_40);
  Promise<void>::attach<kj::String>((Promise<void> *)(local_70 + 0x10),(String *)local_70);
  local_98[0] = copy.content.disposer;
  Promise<void>::
  then<kj::(anonymous_namespace)::TestWebSocketService::doWebSocket(kj::WebSocket&,kj::StringPtr)::_lambda()_1_,kj::_::PropagateException>
            (&local_50,(Type *)(local_70 + 0x10),(PropagateException *)local_98);
  local_a8[0] = copy.content.disposer;
  Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::
  then<kj::(anonymous_namespace)::TestWebSocketService::doWebSocket(kj::WebSocket&,kj::StringPtr)::_lambda(kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>&&)_1_,kj::_::PropagateException>
            ((Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>> *)ws,
             (Type *)&local_50,(PropagateException *)local_a8);
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::~Promise
            ((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
             &local_50);
  Promise<void>::~Promise((Promise<void> *)(local_70 + 0x10));
  Promise<void>::~Promise((Promise<void> *)local_70);
  String::~String((String *)local_40);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)ws;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

static kj::Promise<void> doWebSocket(WebSocket& ws, kj::StringPtr message) {
    auto copy = kj::str(message);
    return ws.send(copy).attach(kj::mv(copy))
        .then([&ws]() {
      return ws.receive();
    }).then([&ws](WebSocket::Message&& message) {
      KJ_SWITCH_ONEOF(message) {
        KJ_CASE_ONEOF(str, kj::String) {
          return doWebSocket(ws, kj::str("reply:", str));
        }
        KJ_CASE_ONEOF(data, kj::Array<byte>) {
          return doWebSocket(ws, kj::str("reply:", data));
        }
        KJ_CASE_ONEOF(close, WebSocket::Close) {
          auto reason = kj::str("close-reply:", close.reason);
          return ws.close(close.code + 1, reason).attach(kj::mv(reason));
        }
      }
      KJ_UNREACHABLE;
    });
  }